

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_crt_verify_top(mbedtls_x509_crt *child,mbedtls_x509_crt *trust_ca,mbedtls_x509_crl *ca_crl,
                       mbedtls_x509_crt_profile *profile,int path_cnt,int self_cnt,uint32_t *flags,
                       _func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *f_vrfy,void *p_vrfy
                       )

{
  mbedtls_pk_type_t type;
  mbedtls_md_type_t md_alg;
  void *options;
  mbedtls_x509_buf *pmVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  mbedtls_md_info_t *md_info_00;
  mbedtls_x509_crl *local_98;
  mbedtls_x509_crt *future_past_ca;
  mbedtls_md_info_t *md_info;
  uchar hash [64];
  uint32_t local_40;
  int check_path_cnt;
  uint32_t ca_flags;
  int ret;
  int self_cnt_local;
  int path_cnt_local;
  mbedtls_x509_crt_profile *profile_local;
  mbedtls_x509_crl *ca_crl_local;
  mbedtls_x509_crt *trust_ca_local;
  mbedtls_x509_crt *child_local;
  
  local_40 = 0;
  local_98 = (mbedtls_x509_crl *)0x0;
  ca_flags = self_cnt;
  ret = path_cnt;
  _self_cnt_local = profile;
  profile_local = (mbedtls_x509_crt_profile *)ca_crl;
  ca_crl_local = (mbedtls_x509_crl *)trust_ca;
  trust_ca_local = child;
  iVar3 = mbedtls_x509_time_is_past(&child->valid_to);
  if (iVar3 != 0) {
    *flags = *flags | 1;
  }
  iVar3 = mbedtls_x509_time_is_future(&trust_ca_local->valid_from);
  if (iVar3 != 0) {
    *flags = *flags | 0x200;
  }
  iVar3 = x509_profile_check_md_alg(_self_cnt_local,trust_ca_local->sig_md);
  if (iVar3 != 0) {
    *flags = *flags | 0x4000;
  }
  iVar3 = x509_profile_check_pk_alg(_self_cnt_local,trust_ca_local->sig_pk);
  if (iVar3 != 0) {
    *flags = *flags | 0x8000;
  }
  *flags = *flags | 8;
  md_info_00 = mbedtls_md_info_from_type(trust_ca_local->sig_md);
  if (md_info_00 == (mbedtls_md_info_t *)0x0) {
    ca_crl_local = (mbedtls_x509_crl *)0x0;
  }
  else {
    mbedtls_md(md_info_00,(trust_ca_local->tbs).p,(trust_ca_local->tbs).len,(uchar *)&md_info);
  }
  for (; ca_crl_local != (mbedtls_x509_crl *)0x0;
      ca_crl_local = *(mbedtls_x509_crl **)&ca_crl_local[1].issuer.val) {
    iVar3 = x509_crt_check_parent
                      (trust_ca_local,(mbedtls_x509_crt *)ca_crl_local,1,(uint)(ret == 0));
    if (iVar3 == 0) {
      hash._60_4_ = ret + 1;
      if (((trust_ca_local->subject_raw).len == (ca_crl_local->issuer).val.len) &&
         (iVar3 = memcmp((trust_ca_local->subject_raw).p,(ca_crl_local->issuer).val.p,
                         (trust_ca_local->issuer_raw).len), iVar3 == 0)) {
        hash._60_4_ = hash._60_4_ + -1;
      }
      if ((*(int *)&ca_crl_local[1].tbs.p < 1) ||
         ((int)(hash._60_4_ - ca_flags) <= *(int *)&ca_crl_local[1].tbs.p)) {
        type = trust_ca_local->sig_pk;
        options = trust_ca_local->sig_opts;
        pmVar1 = &ca_crl_local->crl_ext;
        md_alg = trust_ca_local->sig_md;
        bVar2 = mbedtls_md_get_size(md_info_00);
        iVar3 = mbedtls_pk_verify_ext
                          (type,options,(mbedtls_pk_context *)&pmVar1->len,md_alg,(uchar *)&md_info,
                           (ulong)bVar2,(trust_ca_local->sig).p,(trust_ca_local->sig).len);
        if (iVar3 == 0) {
          iVar3 = mbedtls_x509_time_is_past((mbedtls_x509_time *)&(ca_crl_local->entry).entry_ext.p)
          ;
          if ((iVar3 == 0) &&
             (iVar3 = mbedtls_x509_time_is_future
                                ((mbedtls_x509_time *)&(ca_crl_local->entry).revocation_date.min),
             iVar3 == 0)) break;
          if (local_98 == (mbedtls_x509_crl *)0x0) {
            local_98 = ca_crl_local;
          }
        }
      }
    }
  }
  if ((ca_crl_local != (mbedtls_x509_crl *)0x0) ||
     (ca_crl_local = local_98, local_98 != (mbedtls_x509_crl *)0x0)) {
    *flags = *flags & 0xfffffff7;
    iVar3 = x509_profile_check_key
                      (_self_cnt_local,trust_ca_local->sig_pk,
                       (mbedtls_pk_context *)&(ca_crl_local->crl_ext).len);
    if (iVar3 != 0) {
      *flags = *flags | 0x10000;
    }
  }
  if ((ca_crl_local != (mbedtls_x509_crl *)0x0) &&
     (((trust_ca_local->subject_raw).len != (ca_crl_local->issuer).val.len ||
      (iVar3 = memcmp((trust_ca_local->subject_raw).p,(ca_crl_local->issuer).val.p,
                      (trust_ca_local->issuer_raw).len), iVar3 != 0)))) {
    uVar4 = x509_crt_verifycrl(trust_ca_local,(mbedtls_x509_crt *)ca_crl_local,
                               (mbedtls_x509_crl *)profile_local,_self_cnt_local);
    *flags = uVar4 | *flags;
    iVar3 = mbedtls_x509_time_is_past((mbedtls_x509_time *)&(ca_crl_local->entry).entry_ext.p);
    if (iVar3 != 0) {
      local_40 = local_40 | 1;
    }
    iVar3 = mbedtls_x509_time_is_future
                      ((mbedtls_x509_time *)&(ca_crl_local->entry).revocation_date.min);
    if (iVar3 != 0) {
      local_40 = local_40 | 0x200;
    }
    if (f_vrfy != (_func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *)0x0) {
      iVar3 = (*f_vrfy)(p_vrfy,(mbedtls_x509_crt *)ca_crl_local,ret + 1,&local_40);
      if (iVar3 != 0) {
        return iVar3;
      }
      check_path_cnt = 0;
    }
  }
  if ((f_vrfy == (_func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *)0x0) ||
     (child_local._4_4_ = (*f_vrfy)(p_vrfy,trust_ca_local,ret,flags), child_local._4_4_ == 0)) {
    *flags = local_40 | *flags;
    child_local._4_4_ = 0;
  }
  return child_local._4_4_;
}

Assistant:

static int x509_crt_verify_top(
                mbedtls_x509_crt *child, mbedtls_x509_crt *trust_ca,
                mbedtls_x509_crl *ca_crl,
                const mbedtls_x509_crt_profile *profile,
                int path_cnt, int self_cnt, uint32_t *flags,
                int (*f_vrfy)(void *, mbedtls_x509_crt *, int, uint32_t *),
                void *p_vrfy )
{
    int ret;
    uint32_t ca_flags = 0;
    int check_path_cnt;
    unsigned char hash[MBEDTLS_MD_MAX_SIZE];
    const mbedtls_md_info_t *md_info;
    mbedtls_x509_crt *future_past_ca = NULL;

    if( mbedtls_x509_time_is_past( &child->valid_to ) )
        *flags |= MBEDTLS_X509_BADCERT_EXPIRED;

    if( mbedtls_x509_time_is_future( &child->valid_from ) )
        *flags |= MBEDTLS_X509_BADCERT_FUTURE;

    if( x509_profile_check_md_alg( profile, child->sig_md ) != 0 )
        *flags |= MBEDTLS_X509_BADCERT_BAD_MD;

    if( x509_profile_check_pk_alg( profile, child->sig_pk ) != 0 )
        *flags |= MBEDTLS_X509_BADCERT_BAD_PK;

    /*
     * Child is the top of the chain. Check against the trust_ca list.
     */
    *flags |= MBEDTLS_X509_BADCERT_NOT_TRUSTED;

    md_info = mbedtls_md_info_from_type( child->sig_md );
    if( md_info == NULL )
    {
        /*
         * Cannot check 'unknown', no need to try any CA
         */
        trust_ca = NULL;
    }
    else
        mbedtls_md( md_info, child->tbs.p, child->tbs.len, hash );

    for( /* trust_ca */ ; trust_ca != NULL; trust_ca = trust_ca->next )
    {
        if( x509_crt_check_parent( child, trust_ca, 1, path_cnt == 0 ) != 0 )
            continue;

        check_path_cnt = path_cnt + 1;

        /*
         * Reduce check_path_cnt to check against if top of the chain is
         * the same as the trusted CA
         */
        if( child->subject_raw.len == trust_ca->subject_raw.len &&
            memcmp( child->subject_raw.p, trust_ca->subject_raw.p,
                            child->issuer_raw.len ) == 0 )
        {
            check_path_cnt--;
        }

        /* Self signed certificates do not count towards the limit */
        if( trust_ca->max_pathlen > 0 &&
            trust_ca->max_pathlen < check_path_cnt - self_cnt )
        {
            continue;
        }

        if( mbedtls_pk_verify_ext( child->sig_pk, child->sig_opts, &trust_ca->pk,
                           child->sig_md, hash, mbedtls_md_get_size( md_info ),
                           child->sig.p, child->sig.len ) != 0 )
        {
            continue;
        }

        if( mbedtls_x509_time_is_past( &trust_ca->valid_to ) ||
            mbedtls_x509_time_is_future( &trust_ca->valid_from ) )
        {
            if ( future_past_ca == NULL )
                future_past_ca = trust_ca;

            continue;
        }

        break;
    }

    if( trust_ca != NULL || ( trust_ca = future_past_ca ) != NULL )
    {
        /*
         * Top of chain is signed by a trusted CA
         */
        *flags &= ~MBEDTLS_X509_BADCERT_NOT_TRUSTED;

        if( x509_profile_check_key( profile, child->sig_pk, &trust_ca->pk ) != 0 )
            *flags |= MBEDTLS_X509_BADCERT_BAD_KEY;
    }

    /*
     * If top of chain is not the same as the trusted CA send a verify request
     * to the callback for any issues with validity and CRL presence for the
     * trusted CA certificate.
     */
    if( trust_ca != NULL &&
        ( child->subject_raw.len != trust_ca->subject_raw.len ||
          memcmp( child->subject_raw.p, trust_ca->subject_raw.p,
                            child->issuer_raw.len ) != 0 ) )
    {
#if defined(MBEDTLS_X509_CRL_PARSE_C)
        /* Check trusted CA's CRL for the chain's top crt */
        *flags |= x509_crt_verifycrl( child, trust_ca, ca_crl, profile );
#else
        ((void) ca_crl);
#endif

        if( mbedtls_x509_time_is_past( &trust_ca->valid_to ) )
            ca_flags |= MBEDTLS_X509_BADCERT_EXPIRED;

        if( mbedtls_x509_time_is_future( &trust_ca->valid_from ) )
            ca_flags |= MBEDTLS_X509_BADCERT_FUTURE;

        if( NULL != f_vrfy )
        {
            if( ( ret = f_vrfy( p_vrfy, trust_ca, path_cnt + 1,
                                &ca_flags ) ) != 0 )
            {
                return( ret );
            }
        }
    }

    /* Call callback on top cert */
    if( NULL != f_vrfy )
    {
        if( ( ret = f_vrfy( p_vrfy, child, path_cnt, flags ) ) != 0 )
            return( ret );
    }

    *flags |= ca_flags;

    return( 0 );
}